

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void booke206_update_mas_tlb_miss
               (CPUPPCState_conflict2 *env,target_ulong address,int rw,int mmu_idx)

{
  int iVar1;
  _Bool _Var2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  _Bool pr;
  uint32_t epid;
  _Bool local_1e;
  _Bool local_1d;
  uint32_t local_1c;
  
  _Var2 = mmubooke206_get_as(env,mmu_idx,&local_1c,&local_1e,&local_1d);
  if (rw == 2) {
    local_1e = (_Bool)((byte)env->msr >> 5 & 1);
  }
  uVar5 = (uint)env->spr[0x274];
  env->spr[0x273] = 0;
  env->spr[0x3b0] = 0;
  env->spr[0x272] = address & 0xfffffffffffff000 | (ulong)(uVar5 & 0x1f);
  if (_Var2) {
    uVar3 = (ulong)(local_1c << 0x10);
    uVar7 = uVar3;
    goto LAB_009e3e60;
  }
  switch((uint)(env->spr[0x274] >> 0x10) & 3) {
  case 0:
    lVar4 = 0xc98;
    break;
  case 1:
    lVar4 = 0x1ee0;
    break;
  case 2:
    lVar4 = 0x1ee8;
    break;
  case 3:
    uVar3 = 0;
    goto LAB_009e3e55;
  }
  uVar3 = (ulong)(uint)(*(int *)((long)env->gpr + lVar4) << 0x10);
LAB_009e3e55:
  uVar7 = env->spr[0x30] << 0x10;
LAB_009e3e60:
  uVar8 = (ulong)(uVar5 & 0xf80) + 0x1000;
  if ((local_1e & 1U) == 0) {
    uVar8 = (ulong)(uVar5 & 0xf80);
  }
  env->spr[0x276] = local_1e | uVar7;
  env->spr[0x271] = uVar8 | uVar3 | 0x80000000;
  iVar1 = env->last_way;
  uVar6 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar1 + 1U;
  env->last_way = uVar6;
  env->spr[0x270] = (long)(int)uVar6 | (long)(iVar1 << 0x10) | (ulong)(uVar5 & 0x30000000);
  return;
}

Assistant:

static void booke206_update_mas_tlb_miss(CPUPPCState *env, target_ulong address,
                                     int rw, int mmu_idx)
{
    uint32_t epid;
    bool as, pr;
    uint32_t missed_tid = 0;
    bool use_epid = mmubooke206_get_as(env, mmu_idx, &epid, &as, &pr);
    if (rw == 2) {
        as = msr_ir;
    }
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS6] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    /* AS */
    if (as) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
        env->spr[SPR_BOOKE_MAS6] |= MAS6_SAS;
    }

    env->spr[SPR_BOOKE_MAS1] |= MAS1_VALID;
    env->spr[SPR_BOOKE_MAS2] |= address & MAS2_EPN_MASK;

    if (!use_epid) {
        switch (env->spr[SPR_BOOKE_MAS4] & MAS4_TIDSELD_PIDZ) {
        case MAS4_TIDSELD_PID0:
            missed_tid = env->spr[SPR_BOOKE_PID];
            break;
        case MAS4_TIDSELD_PID1:
            missed_tid = env->spr[SPR_BOOKE_PID1];
            break;
        case MAS4_TIDSELD_PID2:
            missed_tid = env->spr[SPR_BOOKE_PID2];
            break;
        }
        env->spr[SPR_BOOKE_MAS6] |= env->spr[SPR_BOOKE_PID] << 16;
    } else {
        missed_tid = epid;
        env->spr[SPR_BOOKE_MAS6] |= missed_tid << 16;
    }
    env->spr[SPR_BOOKE_MAS1] |= (missed_tid << MAS1_TID_SHIFT);


    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}